

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatFile.cpp
# Opt level: O3

DatFile * __thiscall DatUnpacker::DatFile::operator>>(DatFile *this,int *value)

{
  uint uVar1;
  
  std::istream::read((char *)&this->_ifstream,(long)value);
  if (this->_endianness == Big) {
    uVar1 = *value;
    *value = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  return this;
}

Assistant:

DatFile& DatFile::operator>>(int &value)
    {
        return operator>>((unsigned int&)value);
    }